

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::draw(list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
       *this,canvas *c)

{
  ulong uVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  pointer plVar5;
  rectangle *prVar6;
  unsigned_long uVar7;
  data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pdVar8;
  long *plVar9;
  long l_;
  long r_;
  element_type *peVar10;
  data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pdVar11;
  long lVar12;
  undefined8 in_RSI;
  scrollable_region *in_RDI;
  rectangle r;
  unsigned_long i;
  long y;
  rectangle area;
  canvas *in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  byte bVar13;
  rectangle *in_stack_ffffffffffffff40;
  rectangle local_60;
  ulong local_40;
  long local_38;
  rectangle local_30;
  undefined8 local_10;
  
  local_10 = in_RSI;
  scrollable_region::draw
            ((scrollable_region *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08);
  scrollable_region::display_rect(in_RDI);
  rectangle::intersect
            (in_stack_ffffffffffffff40,
             (rectangle *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  bVar4 = rectangle::is_empty(&local_30);
  if (!bVar4) {
    plVar5 = std::unique_ptr<dlib::list_box_style,_std::default_delete<dlib::list_box_style>_>::
             operator->((unique_ptr<dlib::list_box_style,_std::default_delete<dlib::list_box_style>_>
                         *)0x451465);
    uVar3 = local_10;
    prVar6 = scrollable_region::display_rect(in_RDI);
    (*plVar5->_vptr_list_box_style[2])
              (plVar5,uVar3,prVar6,(ulong)((in_RDI->super_drawable).enabled & 1));
    prVar6 = scrollable_region::total_rect(in_RDI);
    local_38 = rectangle::top(prVar6);
    for (local_40 = 0; uVar1 = local_40,
        uVar7 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                ::size((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                        *)&in_RDI[1].super_drawable.rect.t), lVar12 = local_38, uVar1 < uVar7;
        local_40 = local_40 + 1) {
      pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
               ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                             *)&in_RDI[1].super_drawable.rect.t,local_40);
      uVar7 = pdVar8->height;
      plVar9 = rectangle::top(&local_30);
      if (*plVar9 < (long)(lVar12 + uVar7)) {
        prVar6 = scrollable_region::total_rect(in_RDI);
        l_ = rectangle::left(prVar6);
        lVar12 = local_38;
        prVar6 = scrollable_region::display_rect(in_RDI);
        r_ = rectangle::right(prVar6);
        lVar2 = local_38;
        pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                 ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                               *)&in_RDI[1].super_drawable.rect.t,local_40);
        rectangle::rectangle(&local_60,l_,lVar12,r_,lVar2 + pdVar8->height + -1);
        plVar5 = std::unique_ptr<dlib::list_box_style,_std::default_delete<dlib::list_box_style>_>::
                 operator->((unique_ptr<dlib::list_box_style,_std::default_delete<dlib::list_box_style>_>
                             *)0x45163f);
        uVar3 = local_10;
        prVar6 = scrollable_region::display_rect(in_RDI);
        bVar13 = (in_RDI->super_drawable).enabled;
        peVar10 = std::__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator*((__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                 ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                               *)&in_RDI[1].super_drawable.rect.t,local_40);
        pdVar11 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                  ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                                *)&in_RDI[1].super_drawable.rect.t,local_40);
        in_stack_ffffffffffffff10 = (uint)(pdVar11->is_selected & 1);
        (*plVar5->_vptr_list_box_style[4])
                  (plVar5,uVar3,&local_60,prVar6,(ulong)(bVar13 & 1),peVar10,pdVar8);
        pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                 ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                               *)&in_RDI[1].super_drawable.rect.t,local_40);
        lVar12 = pdVar8->height + local_38;
        local_38 = lVar12;
        plVar9 = rectangle::bottom(&local_30);
        if (*plVar9 < lVar12) {
          return;
        }
      }
      else {
        pdVar8 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                 ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                               *)&in_RDI[1].super_drawable.rect.t,local_40);
        local_38 = pdVar8->height + local_38;
      }
    }
  }
  return;
}

Assistant:

void list_box<S>::
    draw (
        const canvas& c
    ) const
    {
        scrollable_region::draw(c);

        rectangle area = display_rect().intersect(c);
        if (area.is_empty())
            return;

        style->draw_list_box_background(c, display_rect(), enabled);

        long y = total_rect().top();
        for (unsigned long i = 0; i < items.size(); ++i)
        {
            if (y+(long)items[i].height <= area.top())
            {
                y += items[i].height;
                continue;
            }

            rectangle r(total_rect().left(), y, display_rect().right(), y+items[i].height-1);

            style->draw_list_box_item(c,r, display_rect(), enabled, *mfont, items[i].name, items[i].is_selected);


            y += items[i].height;

            if (y > area.bottom())
                break;
        }
    }